

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O3

void lag_stmt(Item *q1,int blocktype)

{
  Symbol *pSVar1;
  Symbol *pSVar2;
  ulong uVar3;
  Symbol *pSVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *__format;
  char *pcVar8;
  char *pcVar9;
  
  pSVar1 = (q1->next->element).sym;
  delete(q1->next);
  delete(q1->next);
  pSVar2 = (q1->next->element).sym;
  delete(q1->next);
  *(byte *)&pSVar1->usage = (byte)pSVar1->usage | 8;
  *(byte *)&pSVar2->usage = (byte)pSVar2->usage | 8;
  if (indepsym == (Symbol *)0x0) {
    diag("INDEPENDENT variable must be declared to process"," the LAG statement");
  }
  if ((pSVar1->subtype & 0x18) == 0) {
    diag(pSVar1->name," not a STATE or DEPENDENT variable");
  }
  if ((pSVar2->subtype & 0x80002) == 0) {
    diag(pSVar2->name," not a CONSTANT or PARAMETER");
  }
  sprintf(buf,"lag_%s_%s",pSVar1->name,pSVar2->name);
  pSVar4 = lookup(buf);
  if (pSVar4 != (Symbol *)0x0) {
    diag(buf," already in use");
  }
  pSVar4 = install(buf,0x13e);
  *(byte *)&pSVar4->usage = (byte)pSVar4->usage | 8;
  uVar3 = pSVar4->subtype;
  uVar5 = uVar3 | 8;
  pSVar4->subtype = uVar5;
  if ((pSVar1->subtype & 0x20) != 0) {
    uVar5 = uVar3 | 0x28;
    pSVar4->subtype = uVar5;
    pSVar4->araydim = pSVar1->araydim;
  }
  if ((uVar5 & 0x20) == 0) {
    sprintf(buf,"static double %s;\n",pSVar4->name);
    linsertstr(procfunc,buf);
    pcVar7 = pSVar4->name;
    pcVar6 = pSVar1->name;
    pcVar8 = indepsym->name;
    pcVar9 = pSVar2->name;
    __format = "%s = *lag(&(%s), %s, %s, 0);\n";
  }
  else {
    sprintf(buf,"static double *%s;\n",pSVar4->name);
    linsertstr(procfunc,buf);
    pcVar7 = pSVar4->name;
    pcVar6 = pSVar1->name;
    pcVar8 = indepsym->name;
    pcVar9 = pSVar2->name;
    __format = "%s = lag(%s, %s, %s, %d);\n";
  }
  sprintf(buf,__format,pcVar7,pcVar6,pcVar8,pcVar9);
  replacstr(q1,buf);
  return;
}

Assistant:

void lag_stmt(q1, blocktype)	/* LAG name1 BY name2 */
	Item *q1;
	int blocktype;
{
	Symbol *name1, *name2, *lagval;

	/*ARGSUSED*/
	/* parse */
	name1 = SYM(q1->next);
	delete(q1->next);
	delete(q1->next);
	name2 = SYM(q1->next);
	delete(q1->next);
	name1->usage |= DEP;
	name2->usage |= DEP;
	/* check */
	if (!indepsym) {
		diag("INDEPENDENT variable must be declared to process",
			" the LAG statement");
	}
	if (!(name1->subtype & (DEP | STAT))) {
		diag(name1->name, " not a STATE or DEPENDENT variable");
	}
	if (!(name2->subtype & (PARM | nmodlCONST))) {
		diag(name2->name, " not a CONSTANT or PARAMETER");
	}
	Sprintf(buf, "lag_%s_%s", name1->name, name2->name);
	if (lookup(buf)) {
		diag(buf, " already in use");
	}
	/* create */
	lagval = install(buf, NAME);
	lagval->usage |= DEP;
	lagval->subtype |= DEP;
	if (name1->subtype & ARRAY) {
		lagval->subtype |= ARRAY;
		lagval->araydim = name1->araydim;
	}
	if (lagval->subtype & ARRAY) {
		Sprintf(buf, "static double *%s;\n", lagval->name);
		Linsertstr(procfunc, buf);
		Sprintf(buf, "%s = lag(%s, %s, %s, %d);\n", lagval->name,
		name1->name, indepsym->name, name2->name, lagval->araydim);
	}else{
		Sprintf(buf, "static double %s;\n", lagval->name);
		Linsertstr(procfunc, buf);
		Sprintf(buf, "%s = *lag(&(%s), %s, %s, 0);\n", lagval->name,
			name1->name, indepsym->name, name2->name);
	}
	replacstr(q1, buf);
}